

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int test_signed<short>(char *Name)

{
  short sVar1;
  ostream *poVar2;
  short local_20;
  short local_1e;
  undefined2 local_1c;
  short local_1a;
  short tmp2;
  uint8_t tmp [2];
  uint8_t cst_minus10_be [2];
  uint8_t cst_minus10_le [2];
  char *Name_local;
  
  _tmp2 = Name;
  memset(&local_1a,0xff,2);
  memset(&local_1c,0xff,2);
  local_1a = CONCAT11(local_1a._1_1_,0xf6);
  local_1c = CONCAT11(0xf6,(uint8_t)local_1c);
  sVar1 = intmem::loadu_le<short>((uint8_t *)&local_1a);
  if (sVar1 == -10) {
    sVar1 = intmem::loadu_be<short>((uint8_t *)&local_1c);
    if (sVar1 == -10) {
      sVar1 = intmem::load_le<short>(&local_1a);
      if (sVar1 == -10) {
        sVar1 = intmem::load_be<short>(&local_1c);
        if (sVar1 == -10) {
          intmem::storeu_le<short>(&local_1e,-10);
          if (local_1e == local_1a) {
            intmem::storeu_be<short>(&local_1e,-10);
            if (local_1e == local_1c) {
              intmem::store_le<short>(&local_20,-10);
              if (local_20 == local_1a) {
                intmem::storeu_be<short>(&local_20,-10);
                if (local_20 == local_1c) {
                  Name_local._4_4_ = 0;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
                  poVar2 = std::operator<<(poVar2,": error storing BE integer!");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  Name_local._4_4_ = 1;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
                poVar2 = std::operator<<(poVar2,": error storing LE integer!");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                Name_local._4_4_ = 1;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
              poVar2 = std::operator<<(poVar2,": error storing BE integer!");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              Name_local._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
            poVar2 = std::operator<<(poVar2,": error storing LE integer!");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            Name_local._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
          poVar2 = std::operator<<(poVar2,": error loading BE signed integer!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          Name_local._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
        poVar2 = std::operator<<(poVar2,": error loading LE signed integer!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Name_local._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
      poVar2 = std::operator<<(poVar2,": error loading BE signed integer!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Name_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,_tmp2);
    poVar2 = std::operator<<(poVar2,": error loading LE signed integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Name_local._4_4_ = 1;
  }
  return Name_local._4_4_;
}

Assistant:

int test_signed(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_minus10_le[sizeof(T)];
  ALIGN(alignof(T)) uint8_t cst_minus10_be[sizeof(T)];
  memset(&cst_minus10_le[0], 0xFF, sizeof(T));
  memset(&cst_minus10_be[0], 0xFF, sizeof(T));
  cst_minus10_le[0] = 0xF6;
  cst_minus10_be[sizeof(T)-1] = 0xF6;
  if (loadu_le<T>(cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }

  uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, -10);
  if (memcmp(tmp, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>((T*) tmp, -10);
  if (memcmp(tmp, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}